

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PPlot.cpp
# Opt level: O2

void __thiscall SVGChart::StringData::AddItem(StringData *this,char *inString)

{
  allocator<char> local_39;
  float local_38 [8];
  
  std::__cxx11::string::string<std::allocator<char>>((string *)local_38,inString,&local_39);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&this->mStringData
             ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38);
  std::__cxx11::string::~string((string *)local_38);
  local_38[0] = (float)(((long)(this->mStringData).
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                         (long)(this->mStringData).
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start >> 5) - 1);
  std::vector<float,_std::allocator<float>_>::emplace_back<float>(&this->mRealPlotData,local_38);
  return;
}

Assistant:

void StringData::AddItem (const char *inString) {
      mStringData.push_back (inString);
      mRealPlotData.push_back (mStringData.size ()-1);
    }